

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

pair<llvm::StringRef,_llvm::StringRef> * __thiscall
llvm::StringRef::split
          (pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef *this,
          StringRef Separator)

{
  unsigned_long *puVar1;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef *local_c0;
  char *local_b8;
  size_t local_b0;
  size_t Idx;
  StringRef *this_local;
  StringRef Separator_local;
  unsigned_long local_88;
  char *local_80;
  StringRef *local_78;
  undefined1 local_70 [16];
  size_t local_60;
  char *local_58;
  undefined1 *local_50;
  size_t local_48;
  unsigned_long local_40;
  StringRef *local_38;
  undefined1 local_30 [16];
  size_t local_20;
  char *local_18;
  undefined1 *local_10;
  
  local_b8 = (char *)Separator.Length;
  local_c0 = (StringRef *)Separator.Data;
  Idx = (size_t)this;
  this_local = local_c0;
  Separator_local.Data = local_b8;
  local_b0 = find(this,Separator,0);
  if (local_b0 == 0xffffffffffffffff) {
    memset(&local_d0,0,0x10);
    StringRef(&local_d0);
    std::make_pair<llvm::StringRef_const&,llvm::StringRef>(__return_storage_ptr__,this,&local_d0);
  }
  else {
    local_40 = 0;
    local_48 = local_b0;
    local_38 = this;
    puVar1 = std::min<unsigned_long>(&local_40,&this->Length);
    local_40 = *puVar1;
    puVar1 = std::max<unsigned_long>(&local_40,&local_48);
    puVar1 = std::min<unsigned_long>(puVar1,&this->Length);
    local_48 = *puVar1;
    local_e0.Data = this->Data + local_40;
    local_e0.Length = local_48 - local_40;
    local_10 = local_30;
    Separator_local.Length = (size_t)&this_local;
    local_80 = Separator_local.Data + local_b0;
    local_88 = 0xffffffffffffffff;
    local_78 = this;
    local_20 = local_e0.Length;
    local_18 = local_e0.Data;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&local_80,&this->Length);
    local_80 = (char *)*puVar1;
    puVar1 = std::max<unsigned_long>((unsigned_long *)&local_80,&local_88);
    puVar1 = std::min<unsigned_long>(puVar1,&this->Length);
    local_88 = *puVar1;
    local_f0.Data = this->Data + (long)local_80;
    local_f0.Length = local_88 - (long)local_80;
    local_50 = local_70;
    local_60 = local_f0.Length;
    local_58 = local_f0.Data;
    std::make_pair<llvm::StringRef,llvm::StringRef>(__return_storage_ptr__,&local_e0,&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

LLVM_NODISCARD
    std::pair<StringRef, StringRef> split(StringRef Separator) const {
      size_t Idx = find(Separator);
      if (Idx == npos)
        return std::make_pair(*this, StringRef());
      return std::make_pair(slice(0, Idx), slice(Idx + Separator.size(), npos));
    }